

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O3

void __thiscall
absl::lts_20250127::strings_internal::BigUnsigned<4>::MultiplyBy(BigUnsigned<4> *this,uint32_t v)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = this->size_;
  uVar3 = (ulong)uVar1;
  if (v == 1 || uVar3 == 0) {
    return;
  }
  if (v == 0) {
    if ((int)uVar1 < 1) {
      iVar4 = 0;
    }
    else {
      iVar4 = 0;
      memset(this->words_,0,uVar3 << 2);
    }
  }
  else {
    if ((int)uVar1 < 1) {
      return;
    }
    uVar5 = 0;
    uVar2 = 0;
    do {
      uVar6 = (ulong)this->words_[uVar5] * (ulong)v + uVar2;
      this->words_[uVar5] = (uint32_t)uVar6;
      uVar2 = uVar6 >> 0x20;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
    if (3 < (int)uVar1) {
      return;
    }
    if (uVar6 >> 0x20 == 0) {
      return;
    }
    this->words_[uVar3] = (uint32_t)(uVar6 >> 0x20);
    iVar4 = this->size_ + 1;
  }
  this->size_ = iVar4;
  return;
}

Assistant:

void MultiplyBy(uint32_t v) {
    if (size_ == 0 || v == 1) {
      return;
    }
    if (v == 0) {
      SetToZero();
      return;
    }
    const uint64_t factor = v;
    uint64_t window = 0;
    for (int i = 0; i < size_; ++i) {
      window += factor * words_[i];
      words_[i] = window & 0xffffffff;
      window >>= 32;
    }
    // If carry bits remain and there's space for them, grow size_.
    if (window && size_ < max_words) {
      words_[size_] = window & 0xffffffff;
      ++size_;
    }
  }